

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbsoluteAdapterBase.hpp
# Opt level: O3

void __thiscall
opengv::absolute_pose::NoncentralAbsoluteAdapter::NoncentralAbsoluteAdapter
          (NoncentralAbsoluteAdapter *this,bearingVectors_t *bearingVectors,
          camCorrespondences_t *camCorrespondences,points_t *points,translations_t *camOffsets,
          rotations_t *camRotations,translation_t *t,rotation_t *R)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  (this->super_AbsoluteAdapterBase)._vptr_AbsoluteAdapterBase =
       (_func_int **)&PTR__AbsoluteAdapterBase_001f2c18;
  dVar1 = (t->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [1];
  (this->super_AbsoluteAdapterBase)._t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[0] =
       (t->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0];
  (this->super_AbsoluteAdapterBase)._t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[1] = dVar1;
  (this->super_AbsoluteAdapterBase)._t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[2] =
       (t->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2];
  dVar1 = (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [1];
  dVar2 = (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [2];
  dVar3 = (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [3];
  dVar4 = (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [4];
  dVar5 = (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [5];
  dVar6 = (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [6];
  dVar7 = (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [7];
  (this->super_AbsoluteAdapterBase)._R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[0] =
       (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0];
  (this->super_AbsoluteAdapterBase)._R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[1] = dVar1;
  (this->super_AbsoluteAdapterBase)._R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[2] = dVar2;
  (this->super_AbsoluteAdapterBase)._R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[3] = dVar3;
  (this->super_AbsoluteAdapterBase)._R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[4] = dVar4;
  (this->super_AbsoluteAdapterBase)._R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[5] = dVar5;
  (this->super_AbsoluteAdapterBase)._R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[6] = dVar6;
  (this->super_AbsoluteAdapterBase)._R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[7] = dVar7;
  (this->super_AbsoluteAdapterBase)._R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[8] =
       (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8];
  (this->super_AbsoluteAdapterBase)._vptr_AbsoluteAdapterBase =
       (_func_int **)&PTR__NoncentralAbsoluteAdapter_001f2ba0;
  this->_bearingVectors = bearingVectors;
  this->_camCorrespondences = camCorrespondences;
  this->_points = points;
  this->_camOffsets = camOffsets;
  this->_camRotations = camRotations;
  return;
}

Assistant:

AbsoluteAdapterBase(
      const opengv::translation_t & t,
      const opengv::rotation_t & R ) :
      _t(t),
      _R(R) {}